

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O0

uint16_t __thiscall snmalloc::LocalEntropy::next_fresh_bits(LocalEntropy *this,size_t n)

{
  uint64_t uVar1;
  unsigned_long uVar2;
  ulong in_RSI;
  LocalEntropy *in_RDI;
  uint16_t result;
  
  if (in_RDI->count <= in_RSI) {
    uVar1 = get_next(in_RDI);
    in_RDI->fresh_bits = uVar1;
    in_RDI->count = 0x40;
  }
  uVar1 = in_RDI->fresh_bits;
  uVar2 = bits::mask_bits<unsigned_long,unsigned_long>(0x128238);
  in_RDI->fresh_bits = in_RDI->fresh_bits >> ((byte)in_RSI & 0x3f);
  in_RDI->count = in_RDI->count - in_RSI;
  return (ushort)uVar1 & (ushort)uVar2;
}

Assistant:

uint16_t next_fresh_bits(size_t n)
    {
      if (count <= n)
      {
        fresh_bits = get_next();
        count = 64;
      }
      uint16_t result = static_cast<uint16_t>(fresh_bits & bits::mask_bits(n));
      fresh_bits >>= n;
      count -= n;
      return result;
    }